

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O3

void __thiscall tcmalloc::GenericWriter::AppendF(GenericWriter *this,char *fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *extraout_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_118 [16];
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  va_list va;
  undefined8 local_48;
  va_list va_1;
  
  if (in_AL != '\0') {
    local_e8 = in_XMM0_Qa;
    local_d8 = in_XMM1_Qa;
    local_c8 = in_XMM2_Qa;
    local_b8 = in_XMM3_Qa;
    local_a8 = in_XMM4_Qa;
    local_98 = in_XMM5_Qa;
    local_88 = in_XMM6_Qa;
    local_78 = in_XMM7_Qa;
  }
  iVar1 = (int)this->buf_end_ - (int)this->buf_fill_;
  va[0]._0_8_ = &stack0x00000008;
  local_68 = 0x3000000010;
  local_108 = in_RDX;
  local_100 = in_RCX;
  local_f8 = in_R8;
  local_f0 = in_R9;
  va[0].overflow_arg_area = local_118;
  iVar2 = vsnprintf(this->buf_fill_,(long)iVar1,fmt,&local_68);
  if (iVar1 <= iVar2) {
    iVar2 = (*this->_vptr_GenericWriter[2])(this,this->buf_,this->buf_fill_,(ulong)(iVar2 + 1));
    this->buf_ = (char *)CONCAT44(extraout_var,iVar2);
    this->buf_end_ = extraout_RDX;
    this->buf_fill_ = (char *)CONCAT44(extraout_var,iVar2);
    va_1[0]._0_8_ = &stack0x00000008;
    local_48 = 0x3000000010;
    iVar2 = (int)this->buf_end_ - (int)this->buf_;
    va_1[0].overflow_arg_area = local_118;
    iVar1 = vsnprintf(this->buf_,(long)iVar2,fmt,&local_48);
    iVar2 = iVar2 + -1;
    if (iVar1 <= iVar2) {
      iVar2 = iVar1;
    }
  }
  this->buf_fill_ = this->buf_fill_ + iVar2;
  return;
}

Assistant:

void GenericWriter::AppendF(const char* fmt, ...) {
  int space_left = buf_end_ - buf_fill_;

  va_list va;
  va_start(va, fmt);
  int written = vsnprintf(buf_fill_, space_left, fmt, va);
  va_end(va);

  if (PREDICT_FALSE(written >= space_left)) {
    std::tie(buf_, buf_end_) = RecycleBuffer(buf_, buf_fill_, written + 1);
    RAW_DCHECK(written < buf_end_ - buf_, "recycled buffer needs to have space for this append");
    buf_fill_ = buf_;

    va_list va;
    va_start(va, fmt);
    space_left = buf_end_ - buf_;
    written = vsnprintf(buf_, space_left, fmt, va);
    va_end(va);

    RAW_DCHECK(written < space_left, "");
    // In case condition above holds (which we only test in debug builds)
    written = std::min<int>(written, space_left - 1);
  }

  buf_fill_ += written;
}